

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

void test_procedures(void)

{
  allocator local_d81;
  string local_d80;
  allocator local_d59;
  string local_d58;
  allocator local_d31;
  string local_d30;
  allocator local_d09;
  string local_d08;
  allocator local_ce1;
  string local_ce0;
  allocator local_cb9;
  string local_cb8;
  allocator local_c91;
  string local_c90;
  allocator local_c69;
  string local_c68;
  allocator local_c41;
  string local_c40;
  allocator local_c19;
  string local_c18;
  allocator local_bf1;
  string local_bf0;
  allocator local_bc9;
  string local_bc8;
  allocator local_ba1;
  string local_ba0;
  allocator local_b79;
  string local_b78;
  allocator local_b51;
  string local_b50;
  allocator local_b29;
  string local_b28;
  allocator local_b01;
  string local_b00;
  allocator local_ad9;
  string local_ad8;
  allocator local_ab1;
  string local_ab0;
  allocator local_a89;
  string local_a88;
  allocator local_a61;
  string local_a60;
  allocator local_a39;
  string local_a38;
  allocator local_a11;
  string local_a10;
  allocator local_9e9;
  string local_9e8;
  allocator local_9c1;
  string local_9c0;
  allocator local_999;
  string local_998;
  allocator local_971;
  string local_970;
  allocator local_949;
  string local_948;
  allocator local_921;
  string local_920;
  allocator local_8f9;
  string local_8f8;
  allocator local_8d1;
  string local_8d0;
  allocator local_8a9;
  string local_8a8;
  allocator local_881;
  string local_880;
  allocator local_859;
  string local_858;
  allocator local_831;
  string local_830;
  allocator local_809;
  string local_808;
  allocator local_7e1;
  string local_7e0;
  allocator local_7b9;
  string local_7b8;
  allocator local_791;
  string local_790;
  allocator local_769;
  string local_768;
  allocator local_741;
  string local_740;
  allocator local_719;
  string local_718;
  allocator local_6f1;
  string local_6f0;
  allocator local_6c9;
  string local_6c8;
  allocator local_6a1;
  string local_6a0;
  allocator local_679;
  string local_678;
  allocator local_651;
  string local_650;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  allocator local_5b1;
  string local_5b0;
  allocator local_589;
  string local_588;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  allocator local_449;
  string local_448;
  allocator local_421;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  allocator local_29;
  string local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28,"(apply + 3 4 \'(5 6))",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"18",&local_61);
  run_test(&local_28,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"(procedure? car)",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"#t",&local_b1);
  run_test(&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"(primitive-procedure? car)",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"#t",&local_101);
  run_test(&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"(compound-procedure? car)",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"#f",&local_151);
  run_test(&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"(procedure? (lambda x x))",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"#t",&local_1a1);
  run_test(&local_178,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,"(primitive-procedure? (lambda x x))",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"#f",&local_1f1);
  run_test(&local_1c8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"(compound-procedure? (lambda x x))",&local_219)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"#t",&local_241);
  run_test(&local_218,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_268,"(equal? (procedure-arity (lambda () 3)) \'(0 . 0))",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,"#t",&local_291);
  run_test(&local_268,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b8,"(equal? (procedure-arity (lambda (x) 3)) \'(1 . 1))",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"#t",&local_2e1);
  run_test(&local_2b8,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_308,"(equal? (procedure-arity car) \'(1 . 1))",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"#t",&local_331);
  run_test(&local_308,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_358,"(equal? (procedure-arity /) \'(1 . #f))",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"#t",&local_381);
  run_test(&local_358,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3a8,"(equal? (procedure-arity (lambda (x #!optional y) x)) \'(1 . 2))"
             ,&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"#t",&local_3d1);
  run_test(&local_3a8,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3f8,
             "(equal? (procedure-arity (lambda (x #!optional y q #!rest z) x)) \'(1 . #f))",
             &local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420,"#t",&local_421);
  run_test(&local_3f8,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_448,"(equal? (procedure-arity make-vector) \'(1 . 2))",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"#t",&local_471);
  run_test(&local_448,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_498,"((make-primitive-procedure \'car) \'(1 2))",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c0,"1",&local_4c1);
  run_test(&local_498,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"(primitive-procedure-name car)",&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"\'car",&local_511);
  run_test(&local_4e8,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_538,
             "(define (f x #!optional y) (cons x y)) (equal? (f 1 2) \'(1 . 2))",&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_560,"#t",&local_561);
  run_test(&local_538,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_588,
             "(define (f x #!optional y) (cons x y)) (default-object? (cdr (f 1 2)))",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b0,"#f",&local_5b1);
  run_test(&local_588,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d8,
             "(define (f x #!optional y) (cons x y)) (default-object? (cdr (f 1)))",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"#t",&local_601);
  run_test(&local_5d8,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_628,"(environment? (the-environment))",&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_650,"#t",&local_651);
  run_test(&local_628,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_678,"(environment-has-parent? (the-environment))",&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a0,"#t",&local_6a1);
  run_test(&local_678,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6c8,"(environment-has-parent? (environment-parent (the-environment)))"
             ,&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f0,"#f",&local_6f1);
  run_test(&local_6c8,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_718,
             "(define x) (equal? (environment-bound-names (the-environment)) \'(x))",&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_740,"#t",&local_741);
  run_test(&local_718,&local_740);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_768,
             "(define x) (define y 5) (equal? (environment-bindings (the-environment)) \'((x) (y 5)))"
             ,&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_790,"#t",&local_791);
  run_test(&local_768,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7b8,"(environment-reference-type (the-environment) \'map)",&local_7b9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e0,"\'normal",&local_7e1);
  run_test(&local_7b8,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_808,"(environment-reference-type (the-environment) \'kek)",&local_809)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_830,"\'unbound",&local_831);
  run_test(&local_808,&local_830);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator((allocator<char> *)&local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_858,"(environment-reference-type (the-environment) \'define)",
             &local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_880,"\'macro",&local_881);
  run_test(&local_858,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8a8,
             "(define define) (environment-reference-type (the-environment) \'define)",&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d0,"\'unassigned",&local_8d1);
  run_test(&local_8a8,&local_8d0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8f8,
             "(define define) (environment-reference-type (environment-parent (the-environment)) \'define)"
             ,&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_920,"\'macro",&local_921);
  run_test(&local_8f8,&local_920);
  std::__cxx11::string::~string((string *)&local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_948,"(define define) (environment-bound? (the-environment) \'define)",
             &local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_970,"#t",&local_971);
  run_test(&local_948,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_998,
             "(define define) (environment-assigned? (the-environment) \'define)",&local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9c0,"#f",&local_9c1);
  run_test(&local_998,&local_9c0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  std::__cxx11::string::~string((string *)&local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9e8,"(define x 5) (environment-lookup (the-environment) \'x)",
             &local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a10,"5",&local_a11);
  run_test(&local_9e8,&local_a10);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a38,"(define x 5) (environment-assign! (the-environment) \'x 6) x",
             &local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a60,"6",&local_a61);
  run_test(&local_a38,&local_a60);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a88,"(environment-define (the-environment) \'x 6) x",&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ab0,"6",&local_ab1);
  run_test(&local_a88,&local_ab0);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ad8,"(define x 5) (eval \'(+ x x) (the-environment))",&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b00,"10",&local_b01);
  run_test(&local_ad8,&local_b00);
  std::__cxx11::string::~string((string *)&local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b28,"(environment-has-parent? user-initial-environment)",&local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b50,"#t",&local_b51);
  run_test(&local_b28,&local_b50);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_b51);
  std::__cxx11::string::~string((string *)&local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b78,"(environment-has-parent? system-global-environment)",&local_b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ba0,"#f",&local_ba1);
  run_test(&local_b78,&local_ba0);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bc8,"(define x 5) (environment-lookup (nearest-repl/environment) \'x)"
             ,&local_bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bf0,"5",&local_bf1);
  run_test(&local_bc8,&local_bf0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c18,"(define map 5) (ge system-global-environment) (procedure? map)",
             &local_c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c40,"#t",&local_c41);
  run_test(&local_c18,&local_c40);
  std::__cxx11::string::~string((string *)&local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  std::__cxx11::string::~string((string *)&local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c68,
             "(define map 5) (ge system-global-environment) (ge user-initial-environment) (procedure? map)"
             ,&local_c69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c90,"#f",&local_c91);
  run_test(&local_c68,&local_c90);
  std::__cxx11::string::~string((string *)&local_c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_c91);
  std::__cxx11::string::~string((string *)&local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_cb8,
             "(define env (make-root-top-level-environment \'(x) \'(5))) (ge env) x",&local_cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ce0,"5",&local_ce1);
  run_test(&local_cb8,&local_ce0);
  std::__cxx11::string::~string((string *)&local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d08,
             "(define env (make-top-level-environment \'(x) \'(5))) (ge env) (procedure? map)",
             &local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d30,"#t",&local_d31);
  run_test(&local_d08,&local_d30);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d58,"(define env (make-top-level-environment \'(x) \'(5))) (ge env) x"
             ,&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d80,"5",&local_d81);
  run_test(&local_d58,&local_d80);
  std::__cxx11::string::~string((string *)&local_d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  std::__cxx11::string::~string((string *)&local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  return;
}

Assistant:

static void test_procedures()
{
    run_test("(apply + 3 4 '(5 6))", "18");
    run_test("(procedure? car)", "#t");
    run_test("(primitive-procedure? car)", "#t");
    run_test("(compound-procedure? car)", "#f");
    run_test("(procedure? (lambda x x))", "#t");
    run_test("(primitive-procedure? (lambda x x))", "#f");
    run_test("(compound-procedure? (lambda x x))", "#t");
    run_test("(equal? (procedure-arity (lambda () 3)) '(0 . 0))", "#t");
    run_test("(equal? (procedure-arity (lambda (x) 3)) '(1 . 1))", "#t");
    run_test("(equal? (procedure-arity car) '(1 . 1))", "#t");
    run_test("(equal? (procedure-arity /) '(1 . #f))", "#t");
    run_test("(equal? (procedure-arity (lambda (x #!optional y) x)) '(1 . 2))", "#t");
    run_test("(equal? (procedure-arity (lambda (x #!optional y q #!rest z) x)) '(1 . #f))", "#t");
    run_test("(equal? (procedure-arity make-vector) '(1 . 2))", "#t");
    run_test("((make-primitive-procedure 'car) '(1 2))", "1");
    run_test("(primitive-procedure-name car)", "'car");
    run_test("(define (f x #!optional y) (cons x y)) (equal? (f 1 2) '(1 . 2))", "#t");
    run_test("(define (f x #!optional y) (cons x y)) (default-object? (cdr (f 1 2)))", "#f");
    run_test("(define (f x #!optional y) (cons x y)) (default-object? (cdr (f 1)))", "#t");

    run_test("(environment? (the-environment))", "#t");
    run_test("(environment-has-parent? (the-environment))", "#t");
    run_test("(environment-has-parent? (environment-parent (the-environment)))", "#f");
    run_test("(define x) (equal? (environment-bound-names (the-environment)) '(x))", "#t");
    run_test("(define x) (define y 5) (equal? (environment-bindings (the-environment)) '((x) (y 5)))", "#t");
    run_test("(environment-reference-type (the-environment) 'map)", "'normal");
    run_test("(environment-reference-type (the-environment) 'kek)", "'unbound");
    run_test("(environment-reference-type (the-environment) 'define)", "'macro");
    run_test("(define define) (environment-reference-type (the-environment) 'define)", "'unassigned");
    run_test("(define define) (environment-reference-type (environment-parent (the-environment)) 'define)", "'macro");
    run_test("(define define) (environment-bound? (the-environment) 'define)", "#t");
    run_test("(define define) (environment-assigned? (the-environment) 'define)", "#f");
    run_test("(define x 5) (environment-lookup (the-environment) 'x)", "5");
    run_test("(define x 5) (environment-assign! (the-environment) 'x 6) x", "6");
    run_test("(environment-define (the-environment) 'x 6) x", "6");
    run_test("(define x 5) (eval '(+ x x) (the-environment))", "10");
    run_test("(environment-has-parent? user-initial-environment)", "#t");
    run_test("(environment-has-parent? system-global-environment)", "#f");
    run_test("(define x 5) (environment-lookup (nearest-repl/environment) 'x)", "5");
    run_test("(define map 5) (ge system-global-environment) (procedure? map)", "#t");
    run_test("(define map 5) (ge system-global-environment) (ge user-initial-environment) (procedure? map)", "#f");
    run_test("(define env (make-root-top-level-environment '(x) '(5))) (ge env) x", "5");
    run_test("(define env (make-top-level-environment '(x) '(5))) (ge env) (procedure? map)", "#t");
    run_test("(define env (make-top-level-environment '(x) '(5))) (ge env) x", "5");
}